

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O0

void InitializeMatrices(TPZSubCompMesh *submesh,TPZAutoPointer<TPZDohrSubstruct<double>_> *substruct
                       ,TPZDohrAssembly<double> *dohrassembly)

{
  TPZBaseMatrix *pTVar1;
  TPZDohrSubstruct<double> *pTVar2;
  TPZMatrix<double> *guiInterface;
  TPZDohrSubstruct<double> *pTVar3;
  TPZCompMesh *this;
  TPZAutoPointer<TPZDohrSubstruct<double>_> *in_RSI;
  TPZFMatrix<double> rhs;
  int64_t ninternal;
  TPZManVector<long,_10> invpermute;
  TPZAutoPointer<TPZGuiInterface> toto;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> skylstr;
  undefined4 in_stack_fffffffffffffcd8;
  DecomposeType in_stack_fffffffffffffcdc;
  TPZStepSolver<double> *in_stack_fffffffffffffce0;
  int64_t in_stack_fffffffffffffce8;
  TPZStructMatrix *in_stack_fffffffffffffcf0;
  TPZCompMesh *in_stack_fffffffffffffcf8;
  TPZStepSolver<double> *obj;
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *in_stack_fffffffffffffd00;
  TPZAutoPointer<TPZBaseMatrix> *this_00;
  TPZAutoPointer<TPZBaseMatrix> *in_stack_fffffffffffffd08;
  TPZMatrixSolver<double> *in_stack_fffffffffffffd10;
  TPZAutoPointer<TPZGuiInterface> *in_stack_fffffffffffffd40;
  TPZBaseMatrix *in_stack_fffffffffffffd48;
  TPZStrMatParInterface *in_stack_fffffffffffffd50;
  TPZVec<long> *in_stack_fffffffffffffea0;
  TPZVec<int> *in_stack_fffffffffffffea8;
  TPZSubCompMesh *in_stack_fffffffffffffeb0;
  TPZStructMatrix local_110;
  
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  operator_new(0x40);
  TPZGuiInterface::TPZGuiInterface((TPZGuiInterface *)in_stack_fffffffffffffce0);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffd00,
             (TPZGuiInterface *)in_stack_fffffffffffffcf8);
  TPZStructMatrix::EquationFilter(&local_110);
  TPZEquationFilter::Reset((TPZEquationFilter *)in_stack_fffffffffffffce0);
  TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffce0,
             (TPZAutoPointer<TPZGuiInterface> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  pTVar1 = TPZStrMatParInterface::CreateAssemble
                     (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40)
  ;
  if (pTVar1 != (TPZBaseMatrix *)0x0) {
    __dynamic_cast(pTVar1,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffd00,
             (TPZMatrix<double> *)in_stack_fffffffffffffcf8);
  TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  TPZAutoPointer<TPZMatrix<double>_>::operator=
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffce0,
             (TPZAutoPointer<TPZMatrix<double>_> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_fffffffffffffce0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffce0);
  pTVar2 = TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  pTVar1 = (TPZBaseMatrix *)&pTVar2->fInvertedStiffness;
  pTVar2 = TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  guiInterface = TPZAutoPointer<TPZMatrix<double>_>::operator->(&pTVar2->fStiffness);
  (*(guiInterface->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x1e])();
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffd00,
             (TPZMatrix<double> *)in_stack_fffffffffffffcf8);
  TPZMatrixSolver<double>::SetMatrix(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffce0);
  TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  TPZStepSolver<double>::SetDirect(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc);
  TPZManVector<long,_10>::TPZManVector
            ((TPZManVector<long,_10> *)in_stack_fffffffffffffd00,(int64_t)in_stack_fffffffffffffcf8)
  ;
  TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  TPZGenSubStruct::ReorderInternalNodes2
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  pTVar3 = TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  this = (TPZCompMesh *)TPZVec<int>::NElements(&pTVar3->fInternalEqs);
  TPZStructMatrix::SetEquationRange
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,(int64_t)in_stack_fffffffffffffce0)
  ;
  TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)this);
  pTVar3 = TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  obj = &pTVar3->fInvertedInternalStiffness;
  this_00 = (TPZAutoPointer<TPZBaseMatrix> *)
            (&local_110.field_0x0 + *(long *)(local_110._0_8_ + -0x60));
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffce0,
             (TPZAutoPointer<TPZGuiInterface> *)
             CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  pTVar1 = TPZStrMatParInterface::CreateAssemble
                     ((TPZStrMatParInterface *)pTVar2,pTVar1,
                      (TPZAutoPointer<TPZGuiInterface> *)guiInterface);
  if (pTVar1 != (TPZBaseMatrix *)0x0) {
    __dynamic_cast(pTVar1,&TPZBaseMatrix::typeinfo,&TPZMatrix<double>::typeinfo,0);
  }
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>(this_00,(TPZMatrix<double> *)obj)
  ;
  TPZMatrixSolver<double>::SetMatrix
            ((TPZMatrixSolver<double> *)this,(TPZAutoPointer<TPZBaseMatrix> *)pTVar3);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)in_stack_fffffffffffffce0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffce0);
  pTVar2 = TPZAutoPointer<TPZDohrSubstruct<double>_>::operator->(in_RSI);
  TPZStepSolver<double>::SetDirect((TPZStepSolver<double> *)pTVar2,in_stack_fffffffffffffcdc);
  TPZCompMesh::Permute(this,(TPZVec<long> *)pTVar3);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x2011658);
  TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)pTVar2);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)pTVar2);
  TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSkylineStructMatrix
            ((TPZSkylineStructMatrix<double,_TPZStructMatrixOR<double>_> *)pTVar2);
  return;
}

Assistant:

void InitializeMatrices(TPZSubCompMesh *submesh, TPZAutoPointer<TPZDohrSubstruct<STATE> > substruct, TPZDohrAssembly<STATE> &dohrassembly)
{
	// this should happen in the remote processor
    TPZSkylineStructMatrix<STATE> skylstr(submesh);
	TPZAutoPointer<TPZGuiInterface> toto = new TPZGuiInterface;

	skylstr.EquationFilter().Reset();
    substruct->fStiffness = TPZAutoPointer<TPZMatrix<STATE> > (
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(substruct->fLocalLoad,toto)));
	
	// This should happen in the remote processor
    substruct->fInvertedStiffness.SetMatrix(substruct->fStiffness->Clone());
    substruct->fInvertedStiffness.SetDirect(ECholesky);
	
	TPZManVector<int64_t> invpermute;
	TPZGenSubStruct::ReorderInternalNodes2(submesh,substruct->fInternalEqs,invpermute);
	// compute the stiffness matrix associated with the internal nodes
	// fInternalEqs indicates the permutation of the global equations to the numbering of the internal equations
	// this is meaningless if the internal nodes are invisible to the global structure
    int64_t ninternal = substruct->fInternalEqs.NElements();
	// THIS SHOULD HAPPEN IN THE REMOTE PROCESSOR
    skylstr.SetEquationRange(0,ninternal);
    TPZFMatrix<STATE> rhs;
    substruct->fInvertedInternalStiffness.SetMatrix(
		dynamic_cast<TPZMatrix<STATE>*>(skylstr.CreateAssemble(rhs,toto)));
    substruct->fInvertedInternalStiffness.SetDirect(ECholesky);
	
    // put back the original sequence numbers of the connects (otherwise we can't apply a load solution
    
	submesh->Permute(invpermute);
	
}